

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O3

void dumpDebugStrings(DWARFContext *DCtx,Data *Y)

{
  pointer *ppSVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  StringRef Separator;
  undefined1 auStack_70 [8];
  pair<llvm::StringRef,_llvm::StringRef> SymbolPair;
  undefined1 auStack_48 [8];
  StringRef RemainingTable;
  
  iVar2 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0x11])();
  auStack_48 = (undefined1  [8])CONCAT44(extraout_var,iVar2);
  if (extraout_RDX != (char *)0x0) {
    SymbolPair.second.Length = (size_t)&Y->DebugStrings;
    RemainingTable.Data = extraout_RDX;
    do {
      RemainingTable.Length._7_1_ = 0;
      Separator.Length = 1;
      Separator.Data = (char *)((long)&RemainingTable.Length + 7);
      llvm::StringRef::split
                ((pair<llvm::StringRef,_llvm::StringRef> *)auStack_70,(StringRef *)auStack_48,
                 Separator);
      auStack_48 = (undefined1  [8])SymbolPair.first.Length;
      RemainingTable.Data = SymbolPair.second.Data;
      __position._M_current =
           (Y->DebugStrings).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (Y->DebugStrings).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
        _M_realloc_insert<llvm::StringRef_const&>
                  ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)
                   SymbolPair.second.Length,__position,(StringRef *)auStack_70);
      }
      else {
        (__position._M_current)->Data = (char *)auStack_70;
        (__position._M_current)->Length = (size_t)SymbolPair.first.Data;
        ppSVar1 = &(Y->DebugStrings).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    } while (RemainingTable.Data != (char *)0x0);
  }
  return;
}

Assistant:

void dumpDebugStrings(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  StringRef RemainingTable = DCtx.getDWARFObj().getStrSection();
  while (RemainingTable.size() > 0) {
    auto SymbolPair = RemainingTable.split('\0');
    RemainingTable = SymbolPair.second;
    Y.DebugStrings.push_back(SymbolPair.first);
  }
}